

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTPNAddrBase::fold_constants(CTPNAddrBase *this,CTcPrsSymtab *symtab)

{
  int iVar1;
  CTcPrsNode *pCVar2;
  undefined4 extraout_var;
  undefined8 in_RSI;
  CTPNUnaryBase *in_RDI;
  CTcPrsNode *ret;
  CTPNUnaryBase *local_28;
  
  pCVar2 = CTPNUnaryBase::get_sub_expr(in_RDI);
  iVar1 = (*(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x10])(pCVar2,in_RSI);
  local_28 = in_RDI;
  if ((CTPNUnaryBase *)CONCAT44(extraout_var,iVar1) != (CTPNUnaryBase *)0x0) {
    local_28 = (CTPNUnaryBase *)CONCAT44(extraout_var,iVar1);
  }
  return &local_28->super_CTcPrsNode;
}

Assistant:

CTcPrsNode *CTPNAddrBase::fold_constants(CTcPrsSymtab *symtab)
{
    CTcPrsNode *ret;

    /* ask the symbol to generate a constant expression for its address */
    ret = get_sub_expr()->fold_addr_const(symtab);

    /* 
     *   if we got a constant value, return it; otherwise, return myself
     *   unchanged 
     */
    return (ret != 0 ? ret : this);
}